

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol.cpp
# Opt level: O2

void ucol_getUCAVersion_63(UCollator *coll,uint8_t *info)

{
  undefined8 in_RAX;
  Collator *c;
  UVersionInfo v;
  undefined1 local_14;
  undefined2 local_13;
  
  local_13 = (undefined2)((ulong)in_RAX >> 0x28);
  if (coll != (UCollator *)0x0) {
    (**(code **)(*(long *)coll + 0xb0))(coll,&local_14);
    *info = (byte)local_13 >> 3;
    info[1] = (byte)local_13 & 7;
    info[2] = local_13._1_1_ >> 6;
    info[3] = '\0';
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
ucol_getUCAVersion(const UCollator* coll, UVersionInfo info) {
    const Collator *c = Collator::fromUCollator(coll);
    if(c != NULL) {
        UVersionInfo v;
        c->getVersion(v);
        // Note: This is tied to how the current implementation encodes the UCA version
        // in the overall getVersion().
        // Alternatively, we could load the root collator and get at lower-level data from there.
        // Either way, it will reflect the input collator's UCA version only
        // if it is a known implementation.
        // It would be cleaner to make this a virtual Collator method.
        info[0] = v[1] >> 3;
        info[1] = v[1] & 7;
        info[2] = v[2] >> 6;
        info[3] = 0;
    }
}